

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldChangeType
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ChangeKind kind;
  StringPtr description;
  Reader value;
  Reader value_00;
  size_t sStackY_150;
  Fault f;
  CapTableReader *pCStack_130;
  void *local_128;
  WirePointer *pWStack_120;
  undefined8 local_118;
  Builder dval;
  Builder name;
  Builder local_b8;
  Builder field;
  Reader nameText;
  
  field._builder.data = decl._builder.data;
  field._builder.pointers = decl._builder.pointers;
  field._builder.dataSize = decl._builder.dataSize;
  field._builder.pointerCount = decl._builder.pointerCount;
  field._builder._38_2_ = decl._builder._38_2_;
  field._builder.segment = decl._builder.segment;
  field._builder.capTable = decl._builder.capTable;
  if (*(short *)((long)decl._builder.data + 0xc) == 0) {
    Declaration::Field::Builder::getType(&dval,&field);
    while (*dval._builder.data == 9) {
      uVar2 = rand();
      if ((uVar2 & 1) == 0) {
        Expression::Builder::initRelativeName((Builder *)&f,&dval);
      }
      else {
        local_b8._builder.dataSize = dval._builder.dataSize;
        local_b8._builder.pointerCount = dval._builder.pointerCount;
        local_b8._builder._38_2_ = dval._builder._38_2_;
        local_b8._builder.data = dval._builder.data;
        local_b8._builder.pointers = dval._builder.pointers;
        local_b8._builder.segment = dval._builder.segment;
        local_b8._builder.capTable = dval._builder.capTable;
        Expression::Application::Builder::getParams((Builder *)&nameText,&local_b8);
        capnp::_::ListBuilder::getStructElement(&name._builder,(ListBuilder *)&nameText,0);
        Expression::Param::Builder::getValue((Builder *)&f,(Builder *)&name._builder);
        dval._builder._32_8_ = local_118;
        dval._builder.segment = (SegmentBuilder *)f.exception;
        dval._builder.capTable = (CapTableBuilder *)pCStack_130;
        dval._builder.data = local_128;
        dval._builder.pointers = pWStack_120;
      }
    }
    Expression::Builder::getRelativeName((Builder *)&name._builder,&dval);
    capnp::_::StructBuilder::asReader(&name._builder);
    nameText = LocatedText::Reader::getValue((Reader *)&f);
    local_b8._builder.segment = (SegmentBuilder *)0x1a0e7c;
    local_b8._builder.capTable = (CapTableBuilder *)0x5;
    bVar1 = kj::StringPtr::startsWith(&nameText.super_StringPtr,(StringPtr *)&local_b8);
    if (bVar1) {
      pcVar3 = "Int32";
      sStackY_150 = 6;
    }
    else {
      pcVar3 = "Text";
      sStackY_150 = 5;
    }
    value.super_StringPtr.content.size_ = sStackY_150;
    value.super_StringPtr.content.ptr = pcVar3;
    LocatedText::Builder::setValue(&name,value);
    pcVar3 = "Change the type of a field.";
    sStackY_150 = 0x1c;
    goto LAB_0010d2ce;
  }
  f.exception = (Exception *)decl._builder.segment;
  Declaration::Field::DefaultValue::Builder::getValue(&dval,(Builder *)&f);
  switch(*dval._builder.data) {
  case 0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x19a,FAILED,(char *)0x0,"\"unknown value expression?\"",
               (char (*) [26])"unknown value expression?");
    kj::_::Debug::Fault::fatal(&f);
  case 1:
    *(undefined2 *)dval._builder.data = 1;
    goto LAB_0010d1b9;
  case 2:
    *(undefined2 *)dval._builder.data = 2;
LAB_0010d1b9:
    *(byte *)((long)dval._builder.data + 8) = *(byte *)((long)dval._builder.data + 8) ^ 1;
    break;
  case 3:
    *(undefined2 *)dval._builder.data = 3;
    *(ulong *)((long)dval._builder.data + 8) =
         *(ulong *)((long)dval._builder.data + 8) ^ 0x8000000000000000;
    break;
  case 4:
  case 6:
  case 7:
  case 8:
    pcVar3 = "Change the default value of a field, but it\'s a pointer field.";
    sStackY_150 = 0x3f;
    kind = NO_CHANGE;
    goto LAB_0010d2d2;
  case 5:
    Expression::Builder::getRelativeName((Builder *)&name._builder,&dval);
    capnp::_::StructBuilder::asReader(&name._builder);
    nameText = LocatedText::Reader::getValue((Reader *)&f);
    f.exception = (Exception *)0x1b943f;
    bVar1 = kj::ArrayPtr<const_char>::operator==
                      ((ArrayPtr<const_char> *)&nameText,(ArrayPtr<const_char> *)&f);
    if (bVar1) {
      pcVar3 = "false";
      sStackY_150 = 6;
    }
    else {
      f.exception = (Exception *)anon_var_dwarf_1ee9d;
      bVar1 = kj::ArrayPtr<const_char>::operator==
                        ((ArrayPtr<const_char> *)&nameText,(ArrayPtr<const_char> *)&f);
      if (bVar1) {
        pcVar3 = "true";
        sStackY_150 = 5;
      }
      else {
        f.exception = (Exception *)anon_var_dwarf_39;
        bVar1 = kj::ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)&nameText,(ArrayPtr<const_char> *)&f);
        if (bVar1) {
          pcVar3 = "bar";
        }
        else {
          pcVar3 = "foo";
        }
        sStackY_150 = 4;
      }
    }
    value_00.super_StringPtr.content.size_ = sStackY_150;
    value_00.super_StringPtr.content.ptr = pcVar3;
    LocatedText::Builder::setValue(&name,value_00);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x1b7,FAILED,(char *)0x0,"\"Unexpected expression type.\"",
               (char (*) [28])"Unexpected expression type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  pcVar3 = "Change the default value of a pritimive field.";
  sStackY_150 = 0x2f;
LAB_0010d2ce:
  kind = INCOMPATIBLE;
LAB_0010d2d2:
  description.content.size_ = sStackY_150;
  description.content.ptr = pcVar3;
  ChangeInfo::ChangeInfo(__return_storage_ptr__,kind,description);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldChangeType(Declaration::Builder decl, uint& nextOrdinal,
                                  bool scopeHasUnion) {
  auto field = decl.getField();

  if (field.getDefaultValue().isNone()) {
    // Change the type.
    auto type = field.getType();
    while (type.isApplication()) {
      // Either change the list parameter, or revert to a non-list.
      if (rand() % 2) {
        type = type.getApplication().getParams()[0].getValue();
      } else {
        type.initRelativeName();
      }
    }
    auto typeName = type.getRelativeName();
    if (typeName.asReader().getValue().startsWith("Text")) {
      typeName.setValue("Int32");
    } else {
      typeName.setValue("Text");
    }
    return { INCOMPATIBLE, "Change the type of a field." };
  } else {
    // Change the default value.
    auto dval = field.getDefaultValue().getValue();
    switch (dval.which()) {
      case Expression::UNKNOWN: KJ_FAIL_ASSERT("unknown value expression?");
      case Expression::POSITIVE_INT: dval.setPositiveInt(dval.getPositiveInt() ^ 1); break;
      case Expression::NEGATIVE_INT: dval.setNegativeInt(dval.getNegativeInt() ^ 1); break;
      case Expression::FLOAT: dval.setFloat(-dval.getFloat()); break;
      case Expression::RELATIVE_NAME: {
        auto name = dval.getRelativeName();
        auto nameText = name.asReader().getValue();
        if (nameText == "true") {
          name.setValue("false");
        } else if (nameText == "false") {
          name.setValue("true");
        } else if (nameText == "foo") {
          name.setValue("bar");
        } else {
          name.setValue("foo");
        }
        break;
      }
      case Expression::STRING:
      case Expression::BINARY:
      case Expression::LIST:
      case Expression::TUPLE:
        return { NO_CHANGE, "Change the default value of a field, but it's a pointer field." };

      case Expression::ABSOLUTE_NAME:
      case Expression::IMPORT:
      case Expression::EMBED:
      case Expression::APPLICATION:
      case Expression::MEMBER:
        KJ_FAIL_ASSERT("Unexpected expression type.");
    }
    return { INCOMPATIBLE, "Change the default value of a pritimive field." };
  }
}